

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

cmServerResponse * __thiscall
cmServer::SetProtocolVersion
          (cmServerResponse *__return_storage_ptr__,cmServer *this,cmServerRequest *request)

{
  cmServerRequest *pcVar1;
  bool bVar2;
  Value *pVVar3;
  cmServerProtocol *pcVar4;
  Int local_3d4;
  Value local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  undefined1 local_300 [8];
  string errorMessage;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  Int local_238;
  Int local_234;
  int minor;
  int major;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1f0 [8];
  Value minorValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [8];
  Value majorValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined4 local_11c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  Value requestedProtocolVersion;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  cmServerRequest *local_20;
  cmServerRequest *request_local;
  cmServer *this_local;
  
  local_20 = request;
  request_local = (cmServerRequest *)this;
  this_local = (cmServer *)__return_storage_ptr__;
  bVar2 = std::operator!=(&request->Type,&kHANDSHAKE_TYPE_abi_cxx11_);
  pcVar1 = local_20;
  if (!bVar2) {
    pVVar3 = Json::Value::operator[](&local_20->Data,&kPROTOCOL_VERSION_KEY_abi_cxx11_);
    Json::Value::Value((Value *)local_98,pVVar3);
    bVar2 = Json::Value::isNull((Value *)local_98);
    pcVar1 = local_20;
    if (bVar2) {
      std::operator+(&local_118,"\"",&kPROTOCOL_VERSION_KEY_abi_cxx11_);
      std::operator+(&local_f8,&local_118,"\" is required for \"");
      std::operator+(&local_d8,&local_f8,&kHANDSHAKE_TYPE_abi_cxx11_);
      std::operator+(&local_b8,&local_d8,"\".");
      cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      local_11c = 1;
    }
    else {
      bVar2 = Json::Value::isObject((Value *)local_98);
      pcVar1 = local_20;
      if (bVar2) {
        pVVar3 = Json::Value::operator[]((Value *)local_98,&kMAJOR_KEY_abi_cxx11_);
        Json::Value::Value((Value *)local_188,pVVar3);
        bVar2 = Json::Value::isInt((Value *)local_188);
        pcVar1 = local_20;
        if (bVar2) {
          pVVar3 = Json::Value::operator[]((Value *)local_98,&kMINOR_KEY_abi_cxx11_);
          Json::Value::Value((Value *)local_1f0,pVVar3);
          bVar2 = Json::Value::isNull((Value *)local_1f0);
          if ((bVar2) || (bVar2 = Json::Value::isInt((Value *)local_1f0), pcVar1 = local_20, bVar2))
          {
            local_234 = Json::Value::asInt((Value *)local_188);
            bVar2 = Json::Value::isNull((Value *)local_1f0);
            if (bVar2) {
              local_3d4 = -1;
            }
            else {
              local_3d4 = Json::Value::asInt((Value *)local_1f0);
            }
            pcVar1 = local_20;
            local_238 = local_3d4;
            if (local_234 < 0) {
              std::operator+(&local_278,"\"",&kMAJOR_KEY_abi_cxx11_);
              std::operator+(&local_258,&local_278,"\" must be >= 0.");
              cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,&local_258);
              std::__cxx11::string::~string((string *)&local_258);
              std::__cxx11::string::~string((string *)&local_278);
              local_11c = 1;
            }
            else {
              bVar2 = Json::Value::isNull((Value *)local_1f0);
              pcVar1 = local_20;
              if ((bVar2) || (-1 < local_238)) {
                pcVar4 = FindMatchingProtocol(&this->SupportedProtocols,local_234,local_238);
                pcVar1 = local_20;
                this->Protocol = pcVar4;
                if (this->Protocol == (cmServerProtocol *)0x0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_2d8,"Protocol version not supported.",
                             (allocator *)(errorMessage.field_2._M_local_buf + 0xf));
                  cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,&local_2d8);
                  std::__cxx11::string::~string((string *)&local_2d8);
                  std::allocator<char>::~allocator
                            ((allocator<char> *)(errorMessage.field_2._M_local_buf + 0xf));
                  local_11c = 1;
                }
                else {
                  std::__cxx11::string::string((string *)local_300);
                  bVar2 = cmServerProtocol::Activate
                                    (this->Protocol,this,local_20,(string *)local_300);
                  pcVar1 = local_20;
                  if (bVar2) {
                    Json::Value::Value(&local_348,objectValue);
                    cmServerRequest::Reply(__return_storage_ptr__,pcVar1,&local_348);
                    Json::Value::~Value(&local_348);
                  }
                  else {
                    this->Protocol = (cmServerProtocol *)0x0;
                    std::operator+(&local_320,"Failed to activate protocol version: ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_300);
                    cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,&local_320);
                    std::__cxx11::string::~string((string *)&local_320);
                  }
                  local_11c = 1;
                  std::__cxx11::string::~string((string *)local_300);
                }
              }
              else {
                std::operator+(&local_2b8,"\"",&kMINOR_KEY_abi_cxx11_);
                std::operator+(&local_298,&local_2b8,"\" must be >= 0 when set.");
                cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,&local_298);
                std::__cxx11::string::~string((string *)&local_298);
                std::__cxx11::string::~string((string *)&local_2b8);
                local_11c = 1;
              }
            }
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &minor,"\"",&kMINOR_KEY_abi_cxx11_);
            std::operator+(&local_210,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &minor,"\" must be unset or an integer.");
            cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,&local_210);
            std::__cxx11::string::~string((string *)&local_210);
            std::__cxx11::string::~string((string *)&minor);
            local_11c = 1;
          }
          Json::Value::~Value((Value *)local_1f0);
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &minorValue.limit_,"\"",&kMAJOR_KEY_abi_cxx11_);
          std::operator+(&local_1a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &minorValue.limit_,"\" must be set and an integer.");
          cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,&local_1a8);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&minorValue.limit_);
          local_11c = 1;
        }
        Json::Value::~Value((Value *)local_188);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &majorValue.limit_,"\"",&kPROTOCOL_VERSION_KEY_abi_cxx11_);
        std::operator+(&local_140,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &majorValue.limit_,"\" must be a JSON object.");
        cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&majorValue.limit_);
        local_11c = 1;
      }
    }
    Json::Value::~Value((Value *)local_98);
    return __return_storage_ptr__;
  }
  std::operator+(&local_60,"Waiting for type \"",&kHANDSHAKE_TYPE_abi_cxx11_);
  std::operator+(&local_40,&local_60,"\".");
  cmServerRequest::ReportError(__return_storage_ptr__,pcVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServer::SetProtocolVersion(const cmServerRequest& request)
{
  if (request.Type != kHANDSHAKE_TYPE) {
    return request.ReportError("Waiting for type \"" + kHANDSHAKE_TYPE +
                               "\".");
  }

  Json::Value requestedProtocolVersion = request.Data[kPROTOCOL_VERSION_KEY];
  if (requestedProtocolVersion.isNull()) {
    return request.ReportError("\"" + kPROTOCOL_VERSION_KEY +
                               "\" is required for \"" + kHANDSHAKE_TYPE +
                               "\".");
  }

  if (!requestedProtocolVersion.isObject()) {
    return request.ReportError("\"" + kPROTOCOL_VERSION_KEY +
                               "\" must be a JSON object.");
  }

  Json::Value majorValue = requestedProtocolVersion[kMAJOR_KEY];
  if (!majorValue.isInt()) {
    return request.ReportError("\"" + kMAJOR_KEY +
                               "\" must be set and an integer.");
  }

  Json::Value minorValue = requestedProtocolVersion[kMINOR_KEY];
  if (!minorValue.isNull() && !minorValue.isInt()) {
    return request.ReportError("\"" + kMINOR_KEY +
                               "\" must be unset or an integer.");
  }

  const int major = majorValue.asInt();
  const int minor = minorValue.isNull() ? -1 : minorValue.asInt();
  if (major < 0) {
    return request.ReportError("\"" + kMAJOR_KEY + "\" must be >= 0.");
  }
  if (!minorValue.isNull() && minor < 0) {
    return request.ReportError("\"" + kMINOR_KEY +
                               "\" must be >= 0 when set.");
  }

  this->Protocol =
    this->FindMatchingProtocol(this->SupportedProtocols, major, minor);
  if (!this->Protocol) {
    return request.ReportError("Protocol version not supported.");
  }

  std::string errorMessage;
  if (!this->Protocol->Activate(this, request, &errorMessage)) {
    this->Protocol = CM_NULLPTR;
    return request.ReportError("Failed to activate protocol version: " +
                               errorMessage);
  }
  return request.Reply(Json::objectValue);
}